

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

int absl::lts_20250127::str_format_internal::SnprintF
              (char *output,size_t size,UntypedFormatSpecImpl format,
              Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  FormatRawSinkImpl raw_sink;
  BufferRawSink sink;
  char *local_28;
  long local_20;
  ulong local_18;
  
  local_20 = size - 1;
  if (size == 0) {
    local_20 = 0;
  }
  local_18 = 0;
  raw_sink.write_ = FormatRawSinkImpl::Flush<absl::lts_20250127::str_format_internal::BufferRawSink>
  ;
  raw_sink.sink_ = &local_28;
  local_28 = output;
  bVar1 = FormatUntyped(raw_sink,format,args);
  if (bVar1) {
    if (size != 0) {
      uVar3 = size - 1;
      if (local_18 <= size - 1) {
        uVar3 = local_18;
      }
      output[uVar3] = '\0';
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    local_18 = 0xffffffff;
  }
  return (int)local_18;
}

Assistant:

int SnprintF(char* output, size_t size, const UntypedFormatSpecImpl format,
             absl::Span<const FormatArgImpl> args) {
  BufferRawSink sink(output, size ? size - 1 : 0);
  if (!FormatUntyped(&sink, format, args)) {
    errno = EINVAL;
    return -1;
  }
  size_t total = sink.total_written();
  if (size) output[std::min(total, size - 1)] = 0;
  return static_cast<int>(total);
}